

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int setup_initial_key(st_quicly_cipher_context_t *ctx,ptls_cipher_suite_t *cs,void *master_secret,
                     char *label,int is_enc,quicly_conn_t *conn)

{
  size_t outlen;
  int iVar1;
  ptls_iovec_t secret;
  uint8_t aead_secret [64];
  
  outlen = cs->hash->digest_size;
  secret.len = outlen;
  secret.base = (uint8_t *)master_secret;
  iVar1 = ptls_hkdf_expand_label
                    (cs->hash,aead_secret,outlen,secret,label,(ptls_iovec_t)ZEXT816(0),(char *)0x0);
  if (iVar1 == 0) {
    iVar1 = setup_cipher(conn,0,is_enc,&ctx->header_protection,&ctx->aead,cs->aead,cs->hash,
                         aead_secret);
  }
  (*ptls_clear_memory)(aead_secret,0x40);
  return iVar1;
}

Assistant:

static int setup_initial_key(struct st_quicly_cipher_context_t *ctx, ptls_cipher_suite_t *cs, const void *master_secret,
                             const char *label, int is_enc, quicly_conn_t *conn)
{
    uint8_t aead_secret[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if ((ret = ptls_hkdf_expand_label(cs->hash, aead_secret, cs->hash->digest_size,
                                      ptls_iovec_init(master_secret, cs->hash->digest_size), label, ptls_iovec_init(NULL, 0),
                                      NULL)) != 0)
        goto Exit;
    if ((ret = setup_cipher(conn, QUICLY_EPOCH_INITIAL, is_enc, &ctx->header_protection, &ctx->aead, cs->aead, cs->hash,
                            aead_secret)) != 0)
        goto Exit;

Exit:
    ptls_clear_memory(aead_secret, sizeof(aead_secret));
    return ret;
}